

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_demo.cc
# Opt level: O0

double integrate<main::__0>(Mesh *mesh,quadDegree_t degree,anon_class_8_1_3fcf66b7 f)

{
  double dVar1;
  Entity *pEVar2;
  long lVar3;
  RefEl ref_el;
  bool bVar4;
  RefElType RVar5;
  RefElType RVar6;
  int iVar7;
  undefined4 extraout_var;
  reference ppEVar8;
  MatrixXd *pMVar9;
  VectorXd *pVVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Index IVar11;
  Scalar *pSVar12;
  double dVar13;
  ColXpr local_190;
  Vector2d local_158;
  long local_148;
  Index j;
  VectorXd integration_elements;
  MatrixXd mapped_points;
  Entity *e;
  iterator __end1;
  iterator __begin1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range1;
  undefined1 local_d8 [8];
  VectorXd weights;
  undefined1 local_c0 [8];
  MatrixXd points;
  undefined1 local_90 [8];
  QuadRule qr_quad;
  undefined1 local_58 [8];
  QuadRule qr_tria;
  double result;
  quadDegree_t degree_local;
  Mesh *mesh_local;
  anon_class_8_1_3fcf66b7 f_local;
  
  qr_tria.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  mesh_local = (Mesh *)f.pi;
  qr_quad.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
  _7_1_ = lf::base::RefEl::kTria();
  lf::quad::make_QuadRule
            ((QuadRule *)local_58,
             qr_quad.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows._7_1_,degree);
  ref_el = lf::base::RefEl::kQuad();
  lf::quad::make_QuadRule((QuadRule *)local_90,ref_el,degree);
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_c0,
             (int *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),
             (int *)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  __range1._4_4_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_d8,(int *)((long)&__range1 + 4));
  iVar7 = (*mesh->_vptr_Mesh[2])(mesh,0);
  __begin1._M_current = (Entity **)CONCAT44(extraout_var,iVar7);
  __end1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  e = (Entity *)
      std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end1,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&e);
    IVar11 = qr_tria.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end1);
    pEVar2 = *ppEVar8;
    iVar7 = (*pEVar2->_vptr_Entity[4])();
    mapped_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _7_1_ = (undefined1)iVar7;
    RVar5 = lf::base::RefEl::operator_cast_to_RefElType
                      ((RefEl *)((long)&mapped_points.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_cols + 7));
    mapped_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _6_1_ = lf::base::RefEl::kTria();
    RVar6 = lf::base::RefEl::operator_cast_to_RefElType
                      ((RefEl *)((long)&mapped_points.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_cols + 6));
    if (RVar5 == RVar6) {
      pMVar9 = lf::quad::QuadRule::Points((QuadRule *)local_58);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_c0,pMVar9);
      pVVar10 = lf::quad::QuadRule::Weights((QuadRule *)local_58);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_d8,pVVar10);
    }
    else {
      pMVar9 = lf::quad::QuadRule::Points((QuadRule *)local_90);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_c0,pMVar9);
      pVVar10 = lf::quad::QuadRule::Weights((QuadRule *)local_90);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_d8,pVVar10);
    }
    iVar7 = (*pEVar2->_vptr_Entity[3])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x18))
              (&integration_elements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,(long *)CONCAT44(extraout_var_00,iVar7),local_c0);
    iVar7 = (*pEVar2->_vptr_Entity[3])();
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x30))
              (&j,(long *)CONCAT44(extraout_var_01,iVar7),local_c0);
    local_148 = 0;
    while( true ) {
      lVar3 = local_148;
      IVar11 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c0);
      if (IVar11 <= lVar3) break;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_190,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 &integration_elements.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 local_148);
      Eigen::Matrix<double,2,1,0,2,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((Matrix<double,2,1,0,2,1> *)&local_158,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_190);
      dVar13 = main::anon_class_8_1_3fcf66b7::operator()
                         ((anon_class_8_1_3fcf66b7 *)&mesh_local,&local_158);
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_d8,
                           local_148);
      dVar1 = *pSVar12;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&j,
                           local_148);
      qr_tria.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows = (Index)(dVar13 * dVar1 * *pSVar12 +
                      (double)qr_tria.weights_.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
      local_148 = local_148 + 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&j);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &integration_elements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end1);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_c0);
  lf::quad::QuadRule::~QuadRule((QuadRule *)local_90);
  lf::quad::QuadRule::~QuadRule((QuadRule *)local_58);
  return (double)IVar11;
}

Assistant:

double integrate(const lf::mesh::Mesh& mesh, lf::quad::quadDegree_t degree,
                 F f) {
  double result = 0.;
  auto qr_tria = lf::quad::make_QuadRule(lf::base::RefEl::kTria(), degree);
  auto qr_quad = lf::quad::make_QuadRule(lf::base::RefEl::kQuad(), degree);

  Eigen::MatrixXd points(1, 1);
  Eigen::VectorXd weights(1);

  for (const auto* e : mesh.Entities(0)) {
    if (e->RefEl() == lf::base::RefEl::kTria()) {
      points = qr_tria.Points();
      weights = qr_tria.Weights();
    } else {
      points = qr_quad.Points();
      weights = qr_quad.Weights();
    }
    auto mapped_points = e->Geometry()->Global(points);
    auto integration_elements = e->Geometry()->IntegrationElement(points);
    for (Eigen::Index j = 0; j < points.cols(); ++j) {
      result += f(mapped_points.col(j)) * weights(j) * integration_elements(j);
    }
  }
  return result;
}